

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberFormatterImpl::format
          (NumberFormatterImpl *this,DecimalQuantity *inValue,NumberStringBuilder *outString,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t end;
  int32_t iVar2;
  int32_t length;
  undefined1 local_118 [8];
  MicroProps micros;
  UErrorCode *status_local;
  NumberStringBuilder *outString_local;
  DecimalQuantity *inValue_local;
  NumberFormatterImpl *this_local;
  
  micros._224_8_ = status;
  MicroProps::MicroProps((MicroProps *)local_118);
  preProcess(this,inValue,(MicroProps *)local_118,(UErrorCode *)micros._224_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)micros._224_8_);
  if (UVar1 == '\0') {
    end = writeNumber((MicroProps *)local_118,inValue,outString,0,(UErrorCode *)micros._224_8_);
    iVar2 = writeAffixes((MicroProps *)local_118,outString,0,end,(UErrorCode *)micros._224_8_);
    this_local._4_4_ = iVar2 + end;
  }
  else {
    this_local._4_4_ = 0;
  }
  MicroProps::~MicroProps((MicroProps *)local_118);
  return this_local._4_4_;
}

Assistant:

int32_t NumberFormatterImpl::format(DecimalQuantity& inValue, NumberStringBuilder& outString,
                                UErrorCode& status) const {
    MicroProps micros;
    preProcess(inValue, micros, status);
    if (U_FAILURE(status)) { return 0; }
    int32_t length = writeNumber(micros, inValue, outString, 0, status);
    length += writeAffixes(micros, outString, 0, length, status);
    return length;
}